

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

shared_ptr<wasm::GCData> __thiscall wasm::Literal::getGCData(Literal *this)

{
  bool bVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  __shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2> *in_RSI;
  shared_ptr<wasm::GCData> sVar2;
  
  bVar1 = wasm::Type::isNull((Type *)(in_RSI + 1));
  if (!bVar1) {
    bVar1 = wasm::Type::isData((Type *)(in_RSI + 1));
    if (!bVar1) {
      __assert_fail("isNull() || isData()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                    ,0x143,"std::shared_ptr<GCData> wasm::Literal::getGCData() const");
    }
  }
  std::__shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2> *)this,in_RSI);
  sVar2.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<wasm::GCData>)
         sVar2.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<GCData> Literal::getGCData() const {
  assert(isNull() || isData());
  return gcData;
}